

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CXMLReaderImpl.h
# Opt level: O1

bool __thiscall
irr::io::CXMLReaderImpl<unsigned_long,_irr::io::IXMLBase>::readFile
          (CXMLReaderImpl<unsigned_long,_irr::io::IXMLBase> *this,IFileReadCallBack *callback)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  long *pointerToStore;
  unsigned_long *puVar4;
  ulong uVar5;
  
  uVar2 = (*callback->_vptr_IFileReadCallBack[3])(callback);
  uVar1 = uVar2 + 4;
  pointerToStore = (long *)operator_new__((long)(int)uVar1);
  iVar3 = (*callback->_vptr_IFileReadCallBack[2])(callback,pointerToStore,(ulong)uVar2);
  if (iVar3 == 0) {
    operator_delete__(pointerToStore);
    goto LAB_0073873b;
  }
  *(undefined4 *)((long)pointerToStore + (long)(int)uVar2) = 0;
  if ((int)uVar2 < 0) {
LAB_007386d9:
    if ((int)uVar2 < -2) {
LAB_0073874f:
      this->SourceFormat = ETF_ASCII;
      uVar5 = 0xffffffffffffffff;
      if (-5 < (int)uVar2) {
        uVar5 = (long)(int)uVar1 << 3;
      }
      puVar4 = (unsigned_long *)operator_new__(uVar5);
      this->TextData = puVar4;
      __assert_fail("numShift < 64",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/contrib/irrXML/CXMLReaderImpl.h"
                    ,0x2a3,
                    "void irr::io::CXMLReaderImpl<unsigned long, irr::io::IXMLBase>::convertTextData(src_char_type *, char *, int) [char_type = unsigned long, superclass = irr::io::IXMLBase, src_char_type = char]"
                   );
    }
    if ((short)*pointerToStore == -0x101) {
      this->SourceFormat = ETF_UTF16_LE;
    }
    else {
      if ((short)*pointerToStore != -2) goto LAB_0073874f;
      this->SourceFormat = ETF_UTF16_BE;
    }
    convertTextData<unsigned_short>
              (this,(unsigned_short *)((long)pointerToStore + 2),(char *)pointerToStore,uVar1 >> 1);
  }
  else {
    if (*pointerToStore == 0xfeff) {
      this->SourceFormat = ETF_UTF32_LE;
    }
    else {
      if (*pointerToStore != -0x20000) goto LAB_007386d9;
      this->SourceFormat = ETF_UTF32_BE;
    }
    convertTextData<unsigned_long>
              (this,(unsigned_long *)(pointerToStore + 1),(char *)pointerToStore,uVar1 >> 2);
  }
LAB_0073873b:
  return iVar3 != 0;
}

Assistant:

bool readFile(IFileReadCallBack* callback)
	{
		int size = callback->getSize();		
		size += 4; // We need two terminating 0's at the end.
		           // For ASCII we need 1 0's, for UTF-16 2, for UTF-32 4.

		char* data8 = new char[size];

		if (!callback->read(data8, size-4))
		{
			delete [] data8;
			return false;
		}

		// add zeros at end

		data8[size-1] = 0;
		data8[size-2] = 0;
		data8[size-3] = 0;
		data8[size-4] = 0;

		char16* data16 = reinterpret_cast<char16*>(data8);
		char32* data32 = reinterpret_cast<char32*>(data8);	

		// now we need to convert the data to the desired target format
		// based on the byte order mark.

		const unsigned char UTF8[] = {0xEF, 0xBB, 0xBF}; // 0xEFBBBF;
		const int UTF16_BE = 0xFFFE;
		const int UTF16_LE = 0xFEFF;
		const int UTF32_BE = 0xFFFE0000;
		const int UTF32_LE = 0x0000FEFF;

		// check source for all utf versions and convert to target data format
		
		if (size >= 4 && data32[0] == (char32)UTF32_BE)
		{
			// UTF-32, big endian
			SourceFormat = ETF_UTF32_BE;
			convertTextData(data32+1, data8, (size/4)); // data32+1 because we need to skip the header
		}
		else
		if (size >= 4 && data32[0] == (char32)UTF32_LE)
		{
			// UTF-32, little endian
			SourceFormat = ETF_UTF32_LE;
			convertTextData(data32+1, data8, (size/4)); // data32+1 because we need to skip the header
		}
		else
		if (size >= 2 && data16[0] == UTF16_BE)
		{
			// UTF-16, big endian
			SourceFormat = ETF_UTF16_BE;
			convertTextData(data16+1, data8, (size/2)); // data16+1 because we need to skip the header
		}
		else
		if (size >= 2 && data16[0] == UTF16_LE)
		{
			// UTF-16, little endian
			SourceFormat = ETF_UTF16_LE;
			convertTextData(data16+1, data8, (size/2)); // data16+1 because we need to skip the header
		}
		else
		if (size >= 3 && data8[0] == UTF8[0] && data8[1] == UTF8[1] && data8[2] == UTF8[2])
		{
			// UTF-8
			SourceFormat = ETF_UTF8;
			convertTextData(data8+3, data8, size); // data8+3 because we need to skip the header
		}
		else
		{
			// ASCII
			SourceFormat = ETF_ASCII;
			convertTextData(data8, data8, size);
		}

		return true;
	}